

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

StringEq * __thiscall MixedArena::alloc<wasm::StringEq>(MixedArena *this)

{
  StringEq *pSVar1;
  
  pSVar1 = (StringEq *)allocSpace(this,0x28,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)87>).super_Expression._id = StringEqId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)87>).super_Expression.type.id = 0;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }